

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framer.h
# Opt level: O3

void __thiscall Framer::~Framer(Framer *this)

{
  ostream *poVar1;
  long *local_28;
  long local_20;
  long local_18 [2];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"------------------",0x12);
  local_28 = local_18;
  std::__cxx11::string::_M_construct((ulong)&local_28,(char)this->m_length_);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_28,local_20);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"------------------\n",0x13);
  if (local_28 != local_18) {
    operator_delete(local_28,local_18[0] + 1);
  }
  return;
}

Assistant:

~Framer()
    {
        std::cout << "------------------" << std::string(m_length_, '-')
                  << "------------------\n";
    }